

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O2

void ParseOptions(int argc,char **argv)

{
  byte bVar1;
  byte *__s2;
  uint uVar2;
  int iVar3;
  undefined8 uVar4;
  ostream *poVar5;
  int iVar6;
  char *msg;
  int iVar7;
  Options local_88;
  char **local_40;
  int local_38;
  uint local_34;
  
  local_88.stdlib_path._M_dataplus._M_p = (pointer)&local_88.stdlib_path.field_2;
  local_88.input_file._M_string_length = 0;
  local_88.input_file.field_2._8_8_ = 0;
  local_88.stdlib_path.field_2._M_allocated_capacity = 0;
  local_88.stdlib_path.field_2._8_8_ = 0;
  local_88.gc_stress = false;
  local_88.heap_verify = false;
  local_88.emit_warnings = false;
  local_88._67_5_ = 0;
  local_88.stdlib_path._M_string_length = 0;
  local_88.input_file._M_dataplus._M_p = (pointer)&local_88.input_file.field_2;
  local_88.input_file.field_2._M_allocated_capacity = 0;
  local_40 = argv;
  local_38 = argc;
  Options::operator=(&g_options,&local_88);
  Options::~Options(&local_88);
  iVar7 = 1;
  local_34 = 0;
LAB_0011dfd9:
  do {
    if (local_38 <= iVar7) {
      return;
    }
    __s2 = (byte *)local_40[iVar7];
    bVar1 = *__s2;
    iVar6 = -(bVar1 - 0x2d);
    iVar3 = iVar6;
    if (bVar1 == 0x2d) {
      uVar2 = __s2[1] - 0x68;
      if (uVar2 == 0) {
        uVar2 = (uint)__s2[2];
      }
      iVar3 = -uVar2;
    }
    if (iVar3 == 0) {
LAB_0011e13e:
      poVar5 = std::operator<<((ostream *)&std::cout,usage);
      std::endl<char,std::char_traits<char>>(poVar5);
      exit(0);
    }
    msg = "--help";
    iVar3 = strcmp("--help",(char *)__s2);
    if (iVar3 == 0) goto LAB_0011e13e;
    iVar3 = iVar6;
    if (bVar1 == 0x2d) {
      uVar2 = __s2[1] - 0x73;
      if (uVar2 == 0) {
        uVar2 = (uint)__s2[2];
      }
      iVar3 = -uVar2;
    }
    if (iVar3 != 0) {
      msg = "--stdlib-path";
      iVar3 = strcmp("--stdlib-path",(char *)__s2);
      if (iVar3 != 0) {
        if (bVar1 == 0x2d) {
          uVar2 = __s2[1] - 0x77;
          if (uVar2 == 0) {
            uVar2 = (uint)__s2[2];
          }
          iVar6 = -uVar2;
        }
        if (iVar6 != 0) {
          iVar3 = strcmp("--warnings",(char *)__s2);
          if (iVar3 != 0) {
            iVar3 = strcmp("--gc-stress",(char *)__s2);
            if (iVar3 == 0) {
              iVar7 = iVar7 + 1;
              g_options.gc_stress = true;
            }
            else {
              iVar3 = strcmp("--heap-verify",(char *)__s2);
              if (iVar3 == 0) {
                iVar7 = iVar7 + 1;
                g_options.heap_verify = true;
              }
              else {
                if ((local_34 & 1) != 0) {
                  poVar5 = std::operator<<((ostream *)&std::cout,"unexpected positional argument: ")
                  ;
                  poVar5 = std::operator<<(poVar5,local_40[iVar7]);
                  std::endl<char,std::char_traits<char>>(poVar5);
                  exit(1);
                }
                iVar7 = iVar7 + 1;
                uVar4 = std::__cxx11::string::assign((char *)&g_options.input_file);
                local_34 = (uint)CONCAT71((int7)((ulong)uVar4 >> 8),1);
              }
            }
            goto LAB_0011dfd9;
          }
        }
        iVar7 = iVar7 + 1;
        g_options.emit_warnings = true;
        goto LAB_0011dfd9;
      }
    }
    if (local_38 <= iVar7 + 1) {
      ParseError(msg);
    }
    iVar7 = iVar7 + 2;
    std::__cxx11::string::assign((char *)&g_options);
  } while( true );
}

Assistant:

void ParseOptions(int argc, char **argv) {
  g_options = Options();
  int i = 1;
  bool seen_input_file = false;
  while (i < argc) {
    if (strcmp("-h", argv[i]) == 0 || strcmp("--help", argv[i]) == 0) {
      std::cout << usage << std::endl;
      std::exit(0);
    }

    if (strcmp("-s", argv[i]) == 0 || strcmp("--stdlib-path", argv[i]) == 0) {
      i++;
      if (i >= argc) {
        ParseError("expected argument for standard library path");
      }

      g_options.stdlib_path = argv[i++];
      continue;
    }

    if (strcmp("-w", argv[i]) == 0 || strcmp("--warnings", argv[i]) == 0) {
      i++;
      g_options.emit_warnings = true;
      continue;
    }

    if (strcmp("--gc-stress", argv[i]) == 0) {
      i++;
      g_options.gc_stress = true;
      continue;
    }

    if (strcmp("--heap-verify", argv[i]) == 0) {
      i++;
      g_options.heap_verify = true;
      continue;
    }

    if (!seen_input_file) {
      seen_input_file = true;
      g_options.input_file = argv[i++];
    } else {
      std::cout << "unexpected positional argument: " << argv[i] << std::endl;
      std::exit(1);
    }
  }
}